

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_mix_pcm_frames_f32
                    (float *pDst,float *pSrc,ma_uint64 frameCount,ma_uint32 channels,float volume)

{
  ma_uint64 sampleCount;
  ma_uint64 iSample;
  float volume_local;
  ma_uint32 channels_local;
  ma_uint64 frameCount_local;
  float *pSrc_local;
  float *pDst_local;
  ma_result local_c;
  
  if (((pDst == (float *)0x0) || (pSrc == (float *)0x0)) || (channels == 0)) {
    local_c = MA_INVALID_ARGS;
  }
  else if ((volume != 0.0) || (NAN(volume))) {
    if ((volume != 1.0) || (NAN(volume))) {
      for (iSample = 0; iSample < frameCount * channels; iSample = iSample + 1) {
        pDst[iSample] = pSrc[iSample] * volume + pDst[iSample];
      }
    }
    else {
      for (iSample = 0; iSample < frameCount * channels; iSample = iSample + 1) {
        pDst[iSample] = pSrc[iSample] + pDst[iSample];
      }
    }
    local_c = MA_SUCCESS;
  }
  else {
    local_c = MA_SUCCESS;
  }
  return local_c;
}

Assistant:

MA_API ma_result ma_mix_pcm_frames_f32(float* pDst, const float* pSrc, ma_uint64 frameCount, ma_uint32 channels, float volume)
{
    ma_uint64 iSample;
    ma_uint64 sampleCount;

    if (pDst == NULL || pSrc == NULL || channels == 0) {
        return MA_INVALID_ARGS;
    }

    if (volume == 0) {
        return MA_SUCCESS;  /* No changes if the volume is 0. */
    }

    sampleCount = frameCount * channels;

    if (volume == 1) {
        for (iSample = 0; iSample < sampleCount; iSample += 1) {
            pDst[iSample] += pSrc[iSample];
        }
    } else {
        for (iSample = 0; iSample < sampleCount; iSample += 1) {
            pDst[iSample] += ma_apply_volume_unclipped_f32(pSrc[iSample], volume);
        }
    }

    return MA_SUCCESS;
}